

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O0

X509 * X509_find_by_subject(stack_st_X509 *sk,X509_NAME *name)

{
  int iVar1;
  X509 *pXVar2;
  X509 *a;
  X509_NAME *a_00;
  X509 *x509;
  size_t i;
  X509_NAME *name_local;
  stack_st_X509 *sk_local;
  
  x509 = (X509 *)0x0;
  while( true ) {
    pXVar2 = (X509 *)sk_X509_num((stack_st_X509 *)sk);
    if (pXVar2 <= x509) {
      return (X509 *)0x0;
    }
    a = (X509 *)sk_X509_value((stack_st_X509 *)sk,(size_t)x509);
    a_00 = X509_get_subject_name(a);
    iVar1 = X509_NAME_cmp(a_00,name);
    if (iVar1 == 0) break;
    x509 = (X509 *)((long)&x509->cert_info + 1);
  }
  return a;
}

Assistant:

X509 *X509_find_by_subject(const STACK_OF(X509) *sk, X509_NAME *name) {
  for (size_t i = 0; i < sk_X509_num(sk); i++) {
    X509 *x509 = sk_X509_value(sk, i);
    if (X509_NAME_cmp(X509_get_subject_name(x509), name) == 0) {
      return x509;
    }
  }
  return NULL;
}